

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseAssetIdentifier
          (AsciiParser *this,AssetPath *out,bool *triple_deliminated)

{
  bool bVar1;
  bool bVar2;
  uint64_t pos;
  reference pvVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  allocator local_3a9;
  string local_3a8;
  string local_388;
  AssetPath local_368;
  allocator local_321;
  string local_320;
  char local_2f9;
  undefined1 local_2f8 [7];
  char c_1;
  string tok_1;
  int at_cnt;
  bool escape_sequence;
  bool found_delimiter_1;
  char local_28a;
  byte local_289;
  undefined1 local_288 [6];
  char c;
  bool found_delimiter;
  string tok;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  ostringstream local_208 [8];
  ostringstream ss_e;
  allocator<char> local_8a;
  char local_89;
  char *local_88;
  undefined8 local_80;
  string local_78 [8];
  string sstr;
  char delim;
  char s;
  bool valid;
  bool maybe_triple;
  uint64_t curr;
  vector<char,_std::allocator<char>_> buf;
  bool *triple_deliminated_local;
  AssetPath *out_local;
  AsciiParser *this_local;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = triple_deliminated;
  ::std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&curr);
  pos = StreamReader::tell(this->_sr);
  bVar2 = false;
  bVar1 = SkipWhitespaceAndNewline(this,true);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_00622462;
  }
  bVar1 = CharN(this,3,(vector<char,_std::allocator<char>_> *)&curr);
  if ((((bVar1) &&
       (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)&curr,0), *pvVar3 == '@')) &&
      (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&curr,1), *pvVar3 == '@')) &&
     (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)&curr,2), *pvVar3 == '@')) {
    bVar2 = true;
  }
  sstr.field_2._M_local_buf[0xf] = '\0';
  if (bVar2) {
    tok_1.field_2._M_local_buf[0xf] = '\0';
    tok_1.field_2._M_local_buf[0xe] = '\0';
    tok_1.field_2._8_4_ = 0;
    ::std::__cxx11::string::string((string *)local_2f8);
    while (bVar2 = Eof(this), ((bVar2 ^ 0xffU) & 1) != 0) {
      bVar2 = Char1(this,&local_2f9);
      if (!bVar2) {
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_0062243c;
      }
      if (local_2f9 == '\\') {
        tok_1.field_2._M_local_buf[0xe] = '\x01';
      }
      if (local_2f9 == '@') {
        tok_1.field_2._8_4_ = tok_1.field_2._8_4_ + 1;
      }
      else {
        tok_1.field_2._8_4_ = tok_1.field_2._8_4_ + -1;
        if ((int)tok_1.field_2._8_4_ < 0) {
          tok_1.field_2._8_4_ = 0;
        }
      }
      ::std::__cxx11::string::operator+=((string *)local_2f8,local_2f9);
      if (tok_1.field_2._8_4_ == 3) {
        if ((tok_1.field_2._M_local_buf[0xe] & 1U) == 0) {
          tok_1.field_2._M_local_buf[0xf] = '\x01';
          break;
        }
        uVar5 = ::std::__cxx11::string::size();
        if (3 < uVar5) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_320,"\\@@@",&local_321);
          bVar2 = endsWith((string *)local_2f8,&local_320);
          ::std::__cxx11::string::~string((string *)&local_320);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
          if (bVar2) {
            lVar6 = ::std::__cxx11::string::size();
            ::std::__cxx11::string::erase((ulong)local_2f8,lVar6 - 4);
            ::std::__cxx11::string::append(local_2f8);
          }
        }
        tok_1.field_2._8_4_ = 0;
        tok_1.field_2._M_local_buf[0xe] = '\0';
      }
    }
    if ((tok_1.field_2._M_local_buf[0xf] & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_3a8,"@@@",&local_3a9);
      removeSuffix(&local_388,(string *)local_2f8,&local_3a8);
      tinyusdz::value::AssetPath::AssetPath(&local_368,&local_388);
      tinyusdz::value::AssetPath::operator=(out,&local_368);
      tinyusdz::value::AssetPath::~AssetPath(&local_368);
      ::std::__cxx11::string::~string((string *)&local_388);
      ::std::__cxx11::string::~string((string *)&local_3a8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      *(undefined1 *)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 1;
      sstr.field_2._M_local_buf[0xf] = '\x01';
    }
    bVar2 = false;
LAB_0062243c:
    ::std::__cxx11::string::~string((string *)local_2f8);
    if (bVar2) goto LAB_00622462;
  }
  else {
    SeekTo(this,pos);
    bVar2 = Char1(this,sstr.field_2._M_local_buf + 0xe);
    if (!bVar2) {
      this_local._7_1_ = 0;
      goto LAB_00622462;
    }
    sstr.field_2._M_local_buf[0xd] = sstr.field_2._M_local_buf[0xe];
    if (((sstr.field_2._M_local_buf[0xe] != '@') && (sstr.field_2._M_local_buf[0xe] != '\'')) &&
       (sstr.field_2._M_local_buf[0xe] != '\"')) {
      local_89 = sstr.field_2._M_local_buf[0xe];
      local_88 = &local_89;
      local_80 = 1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_78,local_88,local_80,&local_8a);
      ::std::allocator<char>::~allocator(&local_8a);
      ::std::__cxx11::ostringstream::ostringstream(local_208);
      poVar4 = ::std::operator<<((ostream *)local_208,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseAssetIdentifier");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x96e);
      ::std::operator<<(poVar4," ");
      ::std::operator+((char *)&local_248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Asset must start with \'@\', \'\'\' or \'\"\', but got \'");
      ::std::operator+(&local_228,&local_248,"\'");
      poVar4 = ::std::operator<<((ostream *)local_208,(string *)&local_228);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::~string((string *)&local_228);
      ::std::__cxx11::string::~string((string *)&local_248);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)((long)&tok.field_2 + 8));
      ::std::__cxx11::string::~string((string *)(tok.field_2._M_local_buf + 8));
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_208);
      ::std::__cxx11::string::~string(local_78);
      goto LAB_00622462;
    }
    ::std::__cxx11::string::string((string *)local_288);
    local_289 = 0;
    while (bVar2 = Eof(this), ((bVar2 ^ 0xffU) & 1) != 0) {
      bVar2 = Char1(this,&local_28a);
      if (!bVar2) {
        this_local._7_1_ = 0;
        bVar2 = true;
        goto LAB_006221b2;
      }
      if (local_28a == sstr.field_2._M_local_buf[0xd]) {
        local_289 = 1;
        break;
      }
      ::std::__cxx11::string::operator+=((string *)local_288,local_28a);
    }
    if ((local_289 & 1) != 0) {
      tinyusdz::value::AssetPath::AssetPath((AssetPath *)&at_cnt,(string *)local_288);
      tinyusdz::value::AssetPath::operator=(out,(AssetPath *)&at_cnt);
      tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&at_cnt);
      *(undefined1 *)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
      sstr.field_2._M_local_buf[0xf] = '\x01';
    }
    bVar2 = false;
LAB_006221b2:
    ::std::__cxx11::string::~string((string *)local_288);
    if (bVar2) goto LAB_00622462;
  }
  this_local._7_1_ = sstr.field_2._M_local_buf[0xf] & 1;
LAB_00622462:
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&curr);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseAssetIdentifier(value::AssetPath *out,
                                       bool *triple_deliminated) {
  // '..' or "..." are also allowed.
  // @...@
  // or @@@...@@@ (Triple '@'-deliminated asset identifier.)
  // @@@ = Path containing '@'. '@@@' in Path is encoded as '\@@@'
  //
  // Example:
  //   @bora@
  //   @@@bora@@@
  //   @@@bora\@@@dora@@@

  // TODO: Correctly support escape characters

  // look ahead.
  std::vector<char> buf;
  uint64_t curr = _sr->tell();
  bool maybe_triple{false};

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (CharN(3, &buf)) {
    if (buf[0] == '@' && buf[1] == '@' && buf[2] == '@') {
      maybe_triple = true;
    }
  }

  bool valid{false};

  if (!maybe_triple) {
    // delimiter = " ' @

    SeekTo(curr);
    char s;
    if (!Char1(&s)) {
      return false;
    }

    char delim = s;

    if ((s == '@') || (s == '\'') || (s == '"')) {
      // ok
    } else {
      std::string sstr{s};
      PUSH_ERROR_AND_RETURN(
          "Asset must start with '@', '\'' or '\"', but got '" + sstr + "'");
    }

    std::string tok;

    // Read until next delimiter
    bool found_delimiter = false;
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == delim) {
        found_delimiter = true;
        break;
      }

      tok += c;
    }

    if (found_delimiter) {
      (*out) = tok;
      (*triple_deliminated) = false;

      valid = true;
    }

  } else {
    bool found_delimiter{false};
    bool escape_sequence{false};
    int at_cnt{0};
    std::string tok;

    // Read until '@@@' appears
    // Need to escaped '@@@'("\\@@@")
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == '\\') {
        escape_sequence = true;
      }

      if (c == '@') {
        at_cnt++;
      } else {
        at_cnt--;
        if (at_cnt < 0) {
          at_cnt = 0;
        }
      }

      tok += c;

      if (at_cnt == 3) {
        if (escape_sequence) {
          // Still in path identifier...
          // Unescape "\\@@@"

          if (tok.size() > 3) {            // this should be true.
            if (endsWith(tok, "\\@@@")) {  // this also should be true.
              tok.erase(tok.size() - 4);
              tok.append("@@@");
            }
          }
          at_cnt = 0;
          escape_sequence = false;
        } else {
          // Got it. '@@@'
          found_delimiter = true;
          break;
        }
      }
    }

    if (found_delimiter) {
      // remote last '@@@'
      (*out) = removeSuffix(tok, "@@@");
      (*triple_deliminated) = true;

      valid = true;
    }
  }

  return valid;
}